

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O0

void __thiscall
iu_MatcherFailure_x_iutest_x_EndsWith_Test::Body(iu_MatcherFailure_x_iutest_x_EndsWith_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5d8;
  Fixed local_5a8;
  anon_class_1_0_00000001 local_419;
  undefined1 local_418 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3c0;
  anon_class_1_0_00000001 local_231;
  undefined1 local_230 [8];
  AssertionResult iutest_spi_ar_1;
  Fixed local_1d8;
  anon_class_1_0_00000001 local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_spi_ar;
  iu_MatcherFailure_x_iutest_x_EndsWith_Test *this_local;
  
  iutest_spi_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x25f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_230,&local_231);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_spi_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x260,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  iutest::detail::AlwaysZero();
  Body::anon_class_1_0_00000001::operator()((AssertionResult *)local_418,&local_419);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    memset(&local_5a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
    iutest::AssertionHelper::AssertionHelper
              (&local_5d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x261,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_5d8,&local_5a8);
    iutest::AssertionHelper::~AssertionHelper(&local_5d8);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  return;
}

Assistant:

IUTEST(MatcherFailure, EndsWith)
{
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("Ge")) , "EndsWith: Ge" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("gee")), "EndsWith: gee" );
    CHECK_FAILURE( IUTEST_ASSERT_THAT("hoge", EndsWith("TooLongLongEnds")) , "EndsWith: TooLongLongEnds" );
}